

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transform.cpp
# Opt level: O0

Wrench * iDynTree::transformWrenchEfficient<iDynTree::Wrench>(Transform *op1,Wrench *op2)

{
  VectorFixSize<3U> *this;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
  *this_00;
  MatrixFixSize<3U,_3U> *this_01;
  Stride<0,_0> *this_02;
  long in_RDX;
  Transform *in_RSI;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_RDI;
  Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_> R;
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> p;
  Wrench *ret;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_stack_fffffffffffffea8;
  Stride<0,_0> *in_stack_fffffffffffffeb0;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *other;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffed0;
  MatrixBase<Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
  *in_stack_fffffffffffffed8;
  MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_ffffffffffffff50;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_ffffffffffffff58;
  
  other = in_RDI;
  Wrench::Wrench((Wrench *)in_stack_fffffffffffffeb0);
  this = &Transform::getPosition(in_RSI)->super_Vector3;
  this_00 = (MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
             *)VectorFixSize<3U>::data(this);
  Eigen::Stride<0,_0>::Stride(in_stack_fffffffffffffeb0);
  Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)other,
             (PointerArgType)in_RDI,in_stack_fffffffffffffeb0);
  this_01 = &Transform::getRotation(in_RSI)->super_Matrix3x3;
  this_02 = (Stride<0,_0> *)MatrixFixSize<3U,_3U>::data(this_01);
  Eigen::Stride<0,_0>::Stride(this_02);
  Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_> *)other,
             (PointerArgType)in_RDI,this_02);
  SpatialVector<iDynTree::SpatialForceVector>::getLinearVec3
            ((SpatialVector<iDynTree::SpatialForceVector> *)(in_RDX + 8));
  toEigen<3U>((VectorFixSize<3U> *)this_00);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>const,0,Eigen::Stride<0,0>>>::
  operator*(this_00,other);
  SpatialVector<iDynTree::SpatialForceVector>::getLinearVec3
            ((SpatialVector<iDynTree::SpatialForceVector> *)(in_RDI + 8));
  toEigen<3U>((VectorFixSize<3U> *)this_00);
  Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>::operator=
            ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)this_02,
             (DenseBase<Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
              *)in_stack_fffffffffffffea8);
  SpatialVector<iDynTree::SpatialForceVector>::getAngularVec3
            ((SpatialVector<iDynTree::SpatialForceVector> *)(in_RDX + 8));
  toEigen<3U>((VectorFixSize<3U> *)this_00);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>const,0,Eigen::Stride<0,0>>>::
  operator*(this_00,other);
  SpatialVector<iDynTree::SpatialForceVector>::getLinearVec3
            ((SpatialVector<iDynTree::SpatialForceVector> *)(in_RDI + 8));
  toEigen<3U>((VectorFixSize<3U> *)this_00);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>::
  cross<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
            (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>const,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>,0>>
  ::operator+(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  SpatialVector<iDynTree::SpatialForceVector>::getAngularVec3
            ((SpatialVector<iDynTree::SpatialForceVector> *)(in_RDI + 8));
  toEigen<3U>((VectorFixSize<3U> *)this_00);
  Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>::operator=
            ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)this_02,
             in_stack_fffffffffffffea8);
  return (Wrench *)other;
}

Assistant:

spatialForceType transformWrenchEfficient(const Transform& op1, const spatialForceType& op2)
    {
        spatialForceType ret;

        Eigen::Map<const Eigen::Vector3d> p(op1.getPosition().data());
        Eigen::Map<const Eigen::Matrix<double,3,3,Eigen::RowMajor> > R(op1.getRotation().data());

        toEigen(ret.getLinearVec3()) = R*toEigen(op2.getLinearVec3());
        toEigen(ret.getAngularVec3())  = R*toEigen(op2.getAngularVec3()) + p.cross(toEigen(ret.getLinearVec3()));

        return ret;
    }